

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O1

void __thiscall
duckdb::CompressedStringScanState::ScanToDictionaryVector
          (CompressedStringScanState *this,ColumnSegment *segment,Vector *result,idx_t result_offset
          ,idx_t start,idx_t scan_count)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  data_ptr_t pdVar2;
  idx_t dictionary_size;
  bool bVar3;
  ColumnSegment *__val;
  Vector *vector;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  char cVar6;
  unsigned_long uVar7;
  SelectionVector *pSVar8;
  type dict;
  type sel;
  VectorBuffer *pVVar9;
  ulong uVar10;
  ColumnSegment *pCVar11;
  char cVar12;
  ulong uVar13;
  sel_t *out;
  ulong uVar14;
  string __str;
  idx_t decompress_count;
  char *local_a0;
  undefined8 local_98;
  char local_90 [8];
  undefined8 uStack_88;
  buffer_ptr<SelectionVector> *local_80;
  ColumnSegment *local_78;
  Vector *local_70;
  ulong local_68;
  ulong local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  char local_48 [8];
  undefined8 uStack_40;
  
  local_60 = scan_count;
  if ((scan_count & 0x1f) != 0) {
    uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)scan_count & 0x1f);
    local_60 = (scan_count - uVar7) + 0x20;
  }
  local_70 = result;
  if (((this->sel_vec).internal.
       super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || (this->sel_vec_size < local_60)) {
    this->sel_vec_size = local_60;
    make_buffer<duckdb::SelectionVector,unsigned_long&>((duckdb *)&local_58,&local_60);
    p_Var5 = p_Stack_50;
    peVar4 = local_58;
    local_58 = (element_type *)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->sel_vec).internal.
              super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar4;
    (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
  }
  local_80 = &this->sel_vec;
  local_78 = segment;
  pSVar8 = shared_ptr<duckdb::SelectionVector,_true>::operator->(&this->sel_vec);
  if (scan_count != 0) {
    out = pSVar8->sel_vector;
    bVar1 = this->current_width;
    local_68 = (ulong)bVar1;
    uVar10 = start * local_68;
    pdVar2 = this->base_data;
    uVar13 = 0;
    uVar14 = 0;
    do {
      duckdb_fastpforlib::fastunpack
                ((uint32_t *)(pdVar2 + (uVar13 >> 3) + (uVar10 >> 3)),out,(uint32_t)local_68);
      uVar14 = uVar14 + 0x20;
      uVar13 = uVar13 + (ulong)bVar1 * 0x20;
      out = out + 0x20;
    } while (uVar14 < scan_count);
  }
  dict = shared_ptr<duckdb::Vector,_true>::operator*(&this->dictionary);
  dictionary_size = this->dictionary_size;
  sel = shared_ptr<duckdb::SelectionVector,_true>::operator*(local_80);
  vector = local_70;
  Vector::Dictionary(local_70,dict,dictionary_size,sel,scan_count);
  __val = local_78;
  cVar12 = '\x01';
  if ((ColumnSegment *)0x9 < local_78) {
    pCVar11 = local_78;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (pCVar11 < (ColumnSegment *)0x64) {
        cVar12 = cVar12 + -2;
        goto LAB_0171553e;
      }
      if (pCVar11 < (ColumnSegment *)0x3e8) {
        cVar12 = cVar12 + -1;
        goto LAB_0171553e;
      }
      if (pCVar11 < (ColumnSegment *)0x2710) goto LAB_0171553e;
      bVar3 = (ColumnSegment *)0x1869f < pCVar11;
      pCVar11 = (ColumnSegment *)((ulong)pCVar11 / 10000);
      cVar6 = cVar12 + '\x04';
    } while (bVar3);
    cVar12 = cVar12 + '\x01';
  }
LAB_0171553e:
  local_a0 = local_90;
  ::std::__cxx11::string::_M_construct((ulong)&local_a0,cVar12);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_a0,(uint)local_98,(unsigned_long)__val);
  DictionaryVector::VerifyDictionary(vector);
  pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  if (local_a0 == local_90) {
    uStack_40 = uStack_88;
    local_58 = (element_type *)local_48;
  }
  else {
    local_58 = (element_type *)local_a0;
  }
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98;
  local_98 = 0;
  local_90[0] = '\0';
  local_a0 = local_90;
  ::std::__cxx11::string::operator=((string *)&pVVar9[1].data.pointer,(string *)&local_58);
  if (local_58 != (element_type *)local_48) {
    operator_delete(local_58);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

void CompressedStringScanState::ScanToDictionaryVector(ColumnSegment &segment, Vector &result, idx_t result_offset,
                                                       idx_t start, idx_t scan_count) {
	D_ASSERT(start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
	D_ASSERT(scan_count == STANDARD_VECTOR_SIZE);
	D_ASSERT(result_offset == 0);

	idx_t decompress_count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize(scan_count);

	// Create a selection vector of sufficient size if we don't already have one.
	if (!sel_vec || sel_vec_size < decompress_count) {
		sel_vec_size = decompress_count;
		sel_vec = make_buffer<SelectionVector>(decompress_count);
	}

	// Scanning 2048 values, emitting a dict vector
	data_ptr_t dst = data_ptr_cast(sel_vec->data());
	data_ptr_t src = data_ptr_cast(&base_data[(start * current_width) / 8]);

	BitpackingPrimitives::UnPackBuffer<sel_t>(dst, src, scan_count, current_width);

	result.Dictionary(*(dictionary), dictionary_size, *sel_vec, scan_count);
	DictionaryVector::SetDictionaryId(result, to_string(CastPointerToValue(&segment)));
}